

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

int __thiscall NULLCFile::FilePrint(NULLCFile *this,NULLCArray arr,File *file)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  char *error;
  
  lVar2 = CONCAT44((int)((ulong)register0x00000010 >> 0x20),arr.len);
  pcVar4 = arr.ptr;
  if (lVar2 == 0) {
    error = "ERROR: null pointer access";
  }
  else {
    if (*(FILE **)(lVar2 + 4) != (FILE *)0x0) {
      if ((int)arr.ptr == 0) {
        uVar3 = 0;
        if (this == (NULLCFile *)0x0) {
          return 0;
        }
      }
      else {
        uVar3 = 0;
        do {
          if (this[uVar3] == (NULLCFile)0x0) goto LAB_00227d07;
          uVar3 = uVar3 + 1;
        } while (((ulong)pcVar4 & 0xffffffff) != uVar3);
        uVar3 = (ulong)pcVar4 & 0xffffffff;
      }
LAB_00227d07:
      sVar1 = fwrite(this,1,uVar3 & 0xffffffff,*(FILE **)(lVar2 + 4));
      return (uint)(sVar1 == (uVar3 & 0xffffffff));
    }
    error = "Cannot write to a closed file.";
    file = (File *)0x0;
  }
  nullcThrowError(error,pcVar4,lVar2,file);
  return 0;
}

Assistant:

int FilePrint(NULLCArray arr, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot write to a closed file.");
			return 0;
		}

		unsigned length = 0;
		for(; length < arr.len; length++)
		{
			if(!arr.ptr[length])
				break;
		}

		return arr.ptr ? length == fwrite(arr.ptr, 1, length, file->handle) : 0;
	}